

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_next_subscription_sync_provides_the_registered_subjects_sorted_by_symbol_and_quantity_Test
::
~SubjectSetRegisterTest_next_subscription_sync_provides_the_registered_subjects_sorted_by_symbol_and_quantity_Test
          (SubjectSetRegisterTest_next_subscription_sync_provides_the_registered_subjects_sorted_by_symbol_and_quantity_Test
           *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, next_subscription_sync_provides_the_registered_subjects_sorted_by_symbol_and_quantity)
{
    SubjectSetRegister subject_register = SubjectSetRegister();
    subject_register.Register(SS_SUBJECT2, false);
    subject_register.Register(SS_SUBJECT0, false);
    subject_register.Register(SS_SUBJECT3, false);
    subject_register.Register(SS_SUBJECT1, false);

    std::optional<SubscriptionSync> message = subject_register.NextSubscriptionSync();
    ASSERT_TRUE(message);
    std::vector<Subject> set_comparison = {SS_SUBJECT0, SS_SUBJECT1, SS_SUBJECT2, SS_SUBJECT3};
    EXPECT_EQ(set_comparison, message->GetSubjects());
}